

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_decoder.c
# Opt level: O0

void free_properties(lzma_block *block,lzma_allocator *allocator)

{
  ulong local_20;
  size_t i;
  lzma_allocator *allocator_local;
  lzma_block *block_local;
  
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    lzma_free(block->filters[local_20].options,allocator);
    block->filters[local_20].id = 0xffffffffffffffff;
    block->filters[local_20].options = (void *)0x0;
  }
  return;
}

Assistant:

static void
free_properties(lzma_block *block, const lzma_allocator *allocator)
{
	// Free allocated filter options. The last array member is not
	// touched after the initialization in the beginning of
	// lzma_block_header_decode(), so we don't need to touch that here.
	for (size_t i = 0; i < LZMA_FILTERS_MAX; ++i) {
		lzma_free(block->filters[i].options, allocator);
		block->filters[i].id = LZMA_VLI_UNKNOWN;
		block->filters[i].options = NULL;
	}

	return;
}